

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void * xmlCopyAttribute(void *payload,xmlChar *name)

{
  undefined8 uVar1;
  xmlAttributePtr attr;
  xmlEnumerationPtr pxVar2;
  xmlChar *pxVar3;
  
  attr = (xmlAttributePtr)(*xmlMalloc)(0x78);
  if (attr == (xmlAttributePtr)0x0) {
    return (void *)0x0;
  }
  attr->_private = (void *)0x0;
  *(undefined8 *)&attr->type = 0;
  attr->tree = (xmlEnumerationPtr)0x0;
  attr->prefix = (xmlChar *)0x0;
  attr->atype = 0;
  attr->def = 0;
  attr->defaultValue = (xmlChar *)0x0;
  attr->doc = (_xmlDoc *)0x0;
  attr->nexth = (_xmlAttribute *)0x0;
  attr->next = (_xmlNode *)0x0;
  attr->prev = (_xmlNode *)0x0;
  attr->last = (_xmlNode *)0x0;
  attr->parent = (_xmlDtd *)0x0;
  attr->name = (xmlChar *)0x0;
  attr->children = (_xmlNode *)0x0;
  attr->elem = (xmlChar *)0x0;
  attr->type = XML_ATTRIBUTE_DECL;
  uVar1 = *(undefined8 *)((long)payload + 0x50);
  attr->atype = (int)uVar1;
  attr->def = (int)((ulong)uVar1 >> 0x20);
  if (*(xmlEnumerationPtr *)((long)payload + 0x60) != (xmlEnumerationPtr)0x0) {
    pxVar2 = xmlCopyEnumeration(*(xmlEnumerationPtr *)((long)payload + 0x60));
    attr->tree = pxVar2;
    if (pxVar2 == (xmlEnumerationPtr)0x0) goto LAB_001517b3;
  }
  if (*(xmlChar **)((long)payload + 0x70) != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x70));
    attr->elem = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_001517b3;
  }
  if (*(xmlChar **)((long)payload + 0x10) != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    attr->name = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_001517b3;
  }
  if (*(xmlChar **)((long)payload + 0x68) != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
    attr->prefix = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_001517b3;
  }
  if (*(xmlChar **)((long)payload + 0x58) == (xmlChar *)0x0) {
    return attr;
  }
  pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x58));
  attr->defaultValue = pxVar3;
  if (pxVar3 != (xmlChar *)0x0) {
    return attr;
  }
LAB_001517b3:
  xmlFreeAttribute(attr);
  return (void *)0x0;
}

Assistant:

static void *
xmlCopyAttribute(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlAttributePtr attr = (xmlAttributePtr) payload;
    xmlAttributePtr cur;

    cur = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlAttribute));
    cur->type = XML_ATTRIBUTE_DECL;
    cur->atype = attr->atype;
    cur->def = attr->def;
    if (attr->tree != NULL) {
        cur->tree = xmlCopyEnumeration(attr->tree);
        if (cur->tree == NULL)
            goto error;
    }
    if (attr->elem != NULL) {
	cur->elem = xmlStrdup(attr->elem);
        if (cur->elem == NULL)
            goto error;
    }
    if (attr->name != NULL) {
	cur->name = xmlStrdup(attr->name);
        if (cur->name == NULL)
            goto error;
    }
    if (attr->prefix != NULL) {
	cur->prefix = xmlStrdup(attr->prefix);
        if (cur->prefix == NULL)
            goto error;
    }
    if (attr->defaultValue != NULL) {
	cur->defaultValue = xmlStrdup(attr->defaultValue);
        if (cur->defaultValue == NULL)
            goto error;
    }
    return(cur);

error:
    xmlFreeAttribute(cur);
    return(NULL);
}